

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O2

void __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>,-1,1,false>,-1,1,true>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>const,-1,1,false>const>const>>
::
copyPacket<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>const,_1,1,false>const>const>,1,0>
          (SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false>,__1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,_1,_false>_>_>_>
           *this,Index index,
          DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,_1,_false>_>_>_>
          *other)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  PointerType pdVar5;
  double dVar6;
  double dVar7;
  
  pdVar5 = (this->m_matrix->
           super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false>,__1,_1,_true,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false>,__1,_1,_true,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false>,__1,_1,_true>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false>,__1,_1,_true>,_0>
           .m_data;
  pdVar1 = pdVar5 + index;
  dVar6 = pdVar1[1];
  pdVar2 = (double *)(*(long *)(other + 8) + index * 8);
  dVar7 = pdVar2[1];
  dVar3 = *(double *)(other + 0x30);
  dVar4 = *(double *)(other + 0x38);
  pdVar5 = pdVar5 + index;
  *pdVar5 = *pdVar1 - dVar4 * dVar3 * *pdVar2;
  pdVar5[1] = dVar6 - dVar4 * dVar3 * dVar7;
  return;
}

Assistant:

void copyPacket(Index index, const DenseBase<OtherDerived>& other)
    {
      OtherDerived& _other = other.const_cast_derived();
      eigen_internal_assert(index >= 0 && index < m_matrix.size());
      m_matrix.template writePacket<StoreMode>(index,
        m_functor.packetOp(m_matrix.template packet<StoreMode>(index),_other.template packet<LoadMode>(index)) );
    }